

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validate.cpp
# Opt level: O2

size_t __thiscall
ktx::ValidationContext::calcLevelOffset
          (ValidationContext *this,size_t firstLevelOffset,size_t alignment,uint32_t level)

{
  unsigned_long uVar1;
  size_t sVar2;
  uint32_t level_00;
  
  if ((this->header).vkFormat == 0) {
    __assert_fail("header.vkFormat != VK_FORMAT_UNDEFINED",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/tools/ktx/validate.cpp"
                  ,0x27b,"size_t ktx::ValidationContext::calcLevelOffset(size_t, size_t, uint32_t)")
    ;
  }
  if ((this->header).supercompressionScheme == 0) {
    if (level < this->numLevels) {
      uVar1 = align<unsigned_long>(firstLevelOffset,alignment);
      level_00 = this->numLevels;
      while (level_00 = level_00 - 1, level < level_00) {
        sVar2 = calcLevelSize(this,level_00);
        uVar1 = align<unsigned_long>(uVar1 + sVar2,alignment);
      }
      return uVar1;
    }
    __assert_fail("level < numLevels",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/tools/ktx/validate.cpp"
                  ,0x27e,"size_t ktx::ValidationContext::calcLevelOffset(size_t, size_t, uint32_t)")
    ;
  }
  __assert_fail("header.supercompressionScheme == KTX_SS_NONE",
                "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/tools/ktx/validate.cpp"
                ,0x27c,"size_t ktx::ValidationContext::calcLevelOffset(size_t, size_t, uint32_t)");
}

Assistant:

size_t ValidationContext::calcLevelOffset(size_t firstLevelOffset, size_t alignment, uint32_t level) {
    // This function is only useful when the following 2 conditions are met
    // as otherwise we have no idea what the size of a level ought to be.
    assert(header.vkFormat != VK_FORMAT_UNDEFINED);
    assert(header.supercompressionScheme == KTX_SS_NONE);

    assert(level < numLevels);
    // Calculate the expected base offset in the file
    size_t levelOffset = align(firstLevelOffset, alignment);
    for (uint32_t i = numLevels - 1; i > level; --i) {
        levelOffset += calcLevelSize(i);
        levelOffset = align(levelOffset, alignment);
    }
    return levelOffset;
}